

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int porterNext(sqlite3_tokenizer_cursor *pCursor,char **pzToken,int *pnBytes,int *piStartOffset,
              int *piEndOffset,int *piPosition)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  int *in_RCX;
  int *in_RSI;
  char *in_RDI;
  undefined4 *in_R8;
  int *in_R9;
  char *unaff_retaddr;
  char *pNew;
  int n;
  int ch;
  int iStartOffset;
  char *z;
  porter_tokenizer_cursor *c;
  undefined2 in_stack_ffffffffffffff98;
  byte in_stack_ffffffffffffff9a;
  byte in_stack_ffffffffffffff9b;
  byte bVar4;
  byte in_stack_ffffffffffffff9d;
  byte in_stack_ffffffffffffff9e;
  byte bVar5;
  char *zOut;
  int in_stack_fffffffffffffffc;
  
  do {
    if (*(int *)(in_RDI + 0x10) <= *(int *)(in_RDI + 0x14)) {
      return 0x65;
    }
    while( true ) {
      bVar5 = 0;
      if (*(int *)(in_RDI + 0x14) < *(int *)(in_RDI + 0x10)) {
        uVar3 = (uint)*(char *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x14));
        in_stack_ffffffffffffff9e = 0;
        bVar5 = 0;
        if (((uVar3 & 0x80) == 0) &&
           (in_stack_ffffffffffffff9d = 1, in_stack_ffffffffffffff9e = in_stack_ffffffffffffff9d,
           bVar5 = in_stack_ffffffffffffff9d, 0x2f < (int)uVar3)) {
          in_stack_ffffffffffffff9d =
               "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)(uVar3 - 0x30)] != '\0' ^ 0xff;
          in_stack_ffffffffffffff9e = in_stack_ffffffffffffff9d;
          bVar5 = in_stack_ffffffffffffff9d;
        }
      }
      if ((bVar5 & 1) == 0) break;
      *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
    }
    iVar1 = *(int *)(in_RDI + 0x14);
    while( true ) {
      bVar4 = 0;
      if (*(int *)(in_RDI + 0x14) < *(int *)(in_RDI + 0x10)) {
        uVar3 = (uint)*(char *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x14));
        in_stack_ffffffffffffff9b = 0;
        if (((uVar3 & 0x80) == 0) &&
           (in_stack_ffffffffffffff9a = 1, in_stack_ffffffffffffff9b = in_stack_ffffffffffffff9a,
           0x2f < (int)uVar3)) {
          in_stack_ffffffffffffff9a =
               "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)(uVar3 - 0x30)] != '\0' ^ 0xff;
          in_stack_ffffffffffffff9b = in_stack_ffffffffffffff9a;
        }
        bVar4 = in_stack_ffffffffffffff9b ^ 0xff;
      }
      if ((bVar4 & 1) == 0) break;
      *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
    }
  } while (*(int *)(in_RDI + 0x14) <= iVar1);
  zOut = in_RDI;
  if (*(int *)(in_RDI + 0x28) < *(int *)(in_RDI + 0x14) - iVar1) {
    *(int *)(in_RDI + 0x28) = (*(int *)(in_RDI + 0x14) - iVar1) + 0x14;
    pvVar2 = sqlite3_realloc((void *)CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff9e,
                                                             CONCAT15(in_stack_ffffffffffffff9d,
                                                                      CONCAT14(bVar4,CONCAT13(
                                                  in_stack_ffffffffffffff9b,
                                                  CONCAT12(in_stack_ffffffffffffff9a,
                                                           in_stack_ffffffffffffff98)))))),0);
    if (pvVar2 == (void *)0x0) {
      return 7;
    }
    *(void **)(in_RDI + 0x20) = pvVar2;
  }
  porter_stemmer(unaff_retaddr,in_stack_fffffffffffffffc,zOut,in_RSI);
  *(undefined8 *)in_RSI = *(undefined8 *)(in_RDI + 0x20);
  *in_RCX = iVar1;
  *in_R8 = *(undefined4 *)(in_RDI + 0x14);
  iVar1 = *(int *)(in_RDI + 0x18);
  *(int *)(in_RDI + 0x18) = iVar1 + 1;
  *in_R9 = iVar1;
  return 0;
}

Assistant:

static int porterNext(
  sqlite3_tokenizer_cursor *pCursor,  /* Cursor returned by porterOpen */
  const char **pzToken,               /* OUT: *pzToken is the token text */
  int *pnBytes,                       /* OUT: Number of bytes in token */
  int *piStartOffset,                 /* OUT: Starting offset of token */
  int *piEndOffset,                   /* OUT: Ending offset of token */
  int *piPosition                     /* OUT: Position integer of token */
){
  porter_tokenizer_cursor *c = (porter_tokenizer_cursor *) pCursor;
  const char *z = c->zInput;

  while( c->iOffset<c->nInput ){
    int iStartOffset, ch;

    /* Scan past delimiter characters */
    while( c->iOffset<c->nInput && isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    /* Count non-delimiter characters. */
    iStartOffset = c->iOffset;
    while( c->iOffset<c->nInput && !isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    if( c->iOffset>iStartOffset ){
      int n = c->iOffset-iStartOffset;
      if( n>c->nAllocated ){
        char *pNew;
        c->nAllocated = n+20;
        pNew = sqlite3_realloc(c->zToken, c->nAllocated);
        if( !pNew ) return SQLITE_NOMEM;
        c->zToken = pNew;
      }
      porter_stemmer(&z[iStartOffset], n, c->zToken, pnBytes);
      *pzToken = c->zToken;
      *piStartOffset = iStartOffset;
      *piEndOffset = c->iOffset;
      *piPosition = c->iToken++;
      return SQLITE_OK;
    }
  }
  return SQLITE_DONE;
}